

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall QHeaderView::initializeSections(QHeaderView *this,int start,int end)

{
  const_iterator it_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ResizeMode RVar4;
  QHeaderViewPrivate *pQVar5;
  qsizetype qVar6;
  int *piVar7;
  ResizeMode *pRVar8;
  const_reference piVar9;
  reference piVar10;
  int in_EDX;
  long in_FS_OFFSET;
  int v;
  int i_2;
  int j;
  int i_1;
  int newSectionCount;
  int newCount;
  int oldCount;
  QHeaderViewPrivate *d;
  iterator it;
  int i;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  ResizeMode in_stack_ffffffffffffff40;
  ResizeMode in_stack_ffffffffffffff44;
  QHash<int,_int> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_80;
  int local_7c;
  ResizeMode local_78;
  ResizeMode RVar11;
  const_iterator local_50;
  piter local_40;
  piter local_30;
  piter local_20;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QHeaderView *)0x83aede);
  QHeaderViewPrivate::invalidateCachedSizeHint
            ((QHeaderViewPrivate *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  local_78 = QHeaderViewPrivate::sectionCount
                       ((QHeaderViewPrivate *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  iVar2 = QHeaderViewPrivate::sectionCount
                    ((QHeaderViewPrivate *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (in_EDX + 1 < iVar2) {
    iVar2 = in_EDX + 1;
    QHeaderViewPrivate::sectionCount
              ((QHeaderViewPrivate *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    QHeaderViewPrivate::removeSectionsFromSectionItems
              ((QHeaderViewPrivate *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    bVar1 = QHash<int,_int>::isEmpty(&pQVar5->hiddenSectionSize);
    if (!bVar1) {
      iVar3 = local_78 - iVar2;
      qVar6 = QHash<int,_int>::size(&pQVar5->hiddenSectionSize);
      if (qVar6 < iVar3) {
        local_c = in_EDX + 1;
        while (in_stack_ffffffffffffff54 = local_c,
              iVar2 = QHeaderViewPrivate::sectionCount
                                ((QHeaderViewPrivate *)
                                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)),
              in_stack_ffffffffffffff54 < iVar2) {
          QHash<int,_int>::remove(&pQVar5->hiddenSectionSize,(char *)&local_c);
          local_c = local_c + 1;
        }
      }
      else {
        local_20.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_20.d = (Data<QHashPrivate::Node<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
        local_20 = (piter)QHash<int,_int>::begin(in_stack_ffffffffffffff48);
        while( true ) {
          local_30 = (piter)QHash<int,_int>::end
                                      ((QHash<int,_int> *)
                                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                                      );
          bVar1 = QHash<int,_int>::iterator::operator!=
                            ((iterator *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (iterator *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          if (!bVar1) break;
          piVar7 = QHash<int,_int>::iterator::key((iterator *)0x83b087);
          if (in_EDX < *piVar7) {
            in_stack_ffffffffffffff48 = &pQVar5->hiddenSectionSize;
            QHash<int,_int>::const_iterator::const_iterator(&local_50,(iterator *)&local_20);
            it_00.i.d._4_4_ = local_78;
            it_00.i.d._0_4_ = iVar2;
            it_00.i.bucket = (size_t)pQVar5;
            local_40 = (piter)QHash<int,_int>::erase(in_stack_ffffffffffffff48,it_00);
            local_20 = local_40;
          }
          else {
            QHash<int,_int>::iterator::operator++
                      ((iterator *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          }
        }
      }
    }
  }
  iVar2 = in_EDX + 1;
  bVar1 = QList<int>::isEmpty((QList<int> *)0x83b134);
  RVar11 = local_78;
  if (!bVar1) {
    if (iVar2 < (int)local_78) {
      local_7c = 0;
      for (local_80 = 0; local_80 < (int)local_78; local_80 = local_80 + 1) {
        piVar9 = QList<int>::at((QList<int> *)
                                CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        iVar3 = *piVar9;
        if (iVar3 < iVar2) {
          piVar10 = QList<int>::operator[]
                              ((QList<int> *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          *piVar10 = iVar3;
          in_stack_ffffffffffffff3c = local_7c;
          piVar10 = QList<int>::operator[]
                              ((QList<int> *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          *piVar10 = in_stack_ffffffffffffff3c;
          local_7c = local_7c + 1;
          in_stack_ffffffffffffff38 = iVar3;
        }
      }
      QList<int>::resize((QList<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                         ,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QList<int>::resize((QList<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                         ,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      RVar11 = local_78;
    }
    else {
      QList<int>::resize((QList<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                         ,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QList<int>::resize((QList<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                         ,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      RVar11 = local_78;
      for (; (int)local_78 < iVar2; local_78 = local_78 + Stretch) {
        in_stack_ffffffffffffff40 = local_78;
        pRVar8 = (ResizeMode *)
                 QList<int>::operator[]
                           ((QList<int> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        *pRVar8 = in_stack_ffffffffffffff40;
        in_stack_ffffffffffffff44 = local_78;
        pRVar8 = (ResizeMode *)
                 QList<int>::operator[]
                           ((QList<int> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        *pRVar8 = in_stack_ffffffffffffff44;
      }
    }
  }
  if (pQVar5->globalResizeMode == Stretch) {
    pQVar5->stretchSections = iVar2;
  }
  else if (pQVar5->globalResizeMode == ResizeToContents) {
    pQVar5->contentsSections = iVar2;
  }
  if ((int)RVar11 < iVar2) {
    QHeaderViewPrivate::createSectionItems
              ((QHeaderViewPrivate *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
  }
  RVar4 = QHeaderViewPrivate::sectionCount
                    ((QHeaderViewPrivate *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (RVar4 != RVar11) {
    QHeaderViewPrivate::sectionCount
              ((QHeaderViewPrivate *)CONCAT44(RVar11,in_stack_ffffffffffffff30));
    sectionCountChanged((QHeaderView *)0x83b35c,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
    ;
  }
  QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::initializeSections(int start, int end)
{
    Q_D(QHeaderView);

    Q_ASSERT(start >= 0);
    Q_ASSERT(end >= 0);

    d->invalidateCachedSizeHint();
    int oldCount = d->sectionCount();

    if (end + 1 < d->sectionCount()) {
        int newCount = end + 1;
        d->removeSectionsFromSectionItems(newCount, d->sectionCount() - 1);
        if (!d->hiddenSectionSize.isEmpty()) {
            if (oldCount - newCount > d->hiddenSectionSize.size()) {
                for (int i = end + 1; i < d->sectionCount(); ++i)
                    d->hiddenSectionSize.remove(i);
            } else {
                QHash<int, int>::iterator it = d->hiddenSectionSize.begin();
                while (it != d->hiddenSectionSize.end()) {
                    if (it.key() > end)
                        it = d->hiddenSectionSize.erase(it);
                    else
                        ++it;
                }
            }
        }
    }

    int newSectionCount = end + 1;

    if (!d->logicalIndices.isEmpty()) {
        if (oldCount <= newSectionCount) {
            d->logicalIndices.resize(newSectionCount);
            d->visualIndices.resize(newSectionCount);
            for (int i = oldCount; i < newSectionCount; ++i) {
                d->logicalIndices[i] = i;
                d->visualIndices[i] = i;
            }
        } else {
            int j = 0;
            for (int i = 0; i < oldCount; ++i) {
                int v = d->logicalIndices.at(i);
                if (v < newSectionCount) {
                    d->logicalIndices[j] = v;
                    d->visualIndices[v] = j;
                    j++;
                }
            }
            d->logicalIndices.resize(newSectionCount);
            d->visualIndices.resize(newSectionCount);
        }
    }

    if (d->globalResizeMode == Stretch)
        d->stretchSections = newSectionCount;
    else if (d->globalResizeMode == ResizeToContents)
         d->contentsSections = newSectionCount;

    if (newSectionCount > oldCount)
        d->createSectionItems(start, end, d->defaultSectionSize, d->globalResizeMode);
    //Q_ASSERT(d->headerLength() == d->length);

    if (d->sectionCount() != oldCount)
        emit sectionCountChanged(oldCount,  d->sectionCount());
    d->viewport->update();
}